

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

uint GetNgonBoundarySegments
               (ON_MeshFaceList *face_list,uint ngon_fi_count,uint *ngon_fi,uint ngon_boundary_index
               ,NgonNeighbors *ngon_nbr_map,ON_SimpleArray<unsigned_int> *ngon_vi,
               ON_SimpleArray<unsigned_int> *ngon_side)

{
  ulong uVar1;
  int iVar2;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  NgonNeighbors *pNVar11;
  bool bVar12;
  uint vi1;
  uint Fvi [4];
  uint vi0;
  ulong local_70;
  uint *local_68;
  ON_MeshFaceList *local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  NgonNeighbors *local_48;
  undefined8 local_40;
  ulong local_38;
  
  local_40 = CONCAT44(in_register_00000034,ngon_fi_count);
  uVar4 = (ulong)ngon_boundary_index;
  uVar6 = 0;
  uVar7 = 0;
  if (ngon_nbr_map != (NgonNeighbors *)0x0 && (ngon_fi != (uint *)0x0 && ngon_fi_count != 0)) {
    local_68 = ngon_fi;
    local_60 = face_list;
    if (ngon_fi_count == 1) {
      uVar7 = uVar6;
      if ((((ngon_nbr_map->m_NFS[0] == 0) && (ngon_nbr_map->m_NFS[1] == 0)) &&
          (ngon_nbr_map->m_NFS[2] == 0)) && (ngon_nbr_map->m_NFS[3] == 0)) {
        ON_MeshFaceList::QuadFvi(face_list,*ngon_fi,Fvi);
        if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
          ON_SimpleArray<unsigned_int>::Append(ngon_vi,Fvi);
        }
        if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
          puVar3 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
          *puVar3 = 0;
        }
        ngon_nbr_map->m_NFS[0] = uVar4 * 8 + 1;
        if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
          ON_SimpleArray<unsigned_int>::Append(ngon_vi,Fvi + 1);
        }
        if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
          puVar3 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
          *puVar3 = 1;
        }
        uVar7 = ngon_boundary_index + 2;
        ngon_nbr_map->m_NFS[1] = (ulong)(ngon_boundary_index + 1) * 8 + 1;
        if (Fvi[2] != Fvi[3]) {
          if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
            ON_SimpleArray<unsigned_int>::Append(ngon_vi,Fvi + 2);
          }
          if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
            puVar3 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
            *puVar3 = 2;
          }
          uVar4 = (ulong)uVar7;
          uVar7 = ngon_boundary_index + 3;
          ngon_nbr_map->m_NFS[2] = uVar4 * 8 + 1;
        }
        if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
          ON_SimpleArray<unsigned_int>::Append(ngon_vi,Fvi + 3);
        }
        if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
          puVar3 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
          *puVar3 = 3;
        }
        ngon_nbr_map->m_NFS[3] = (ulong)uVar7 * 8 + 1;
        uVar7 = (uVar7 - ngon_boundary_index) + 1;
      }
    }
    else {
      iVar10 = 0;
      local_48 = ngon_nbr_map;
      for (local_70 = 0; local_70 != ngon_fi_count; local_70 = local_70 + 1) {
        ON_MeshFaceList::QuadFvi(local_60,local_68[local_70],Fvi);
        for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
          iVar2 = (int)lVar8;
          if ((Fvi[lVar8] != Fvi[iVar2 + 1U & 3]) && (ngon_nbr_map->m_NFS[lVar8] == 0)) {
            ngon_nbr_map->m_NFS[lVar8] = uVar4 * 8 + 1;
            if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
              puVar3 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
              *puVar3 = iVar2 - iVar10;
            }
            pNVar11 = local_48;
            vi0 = Fvi[lVar8];
            uVar9 = (ulong)(iVar2 + 1U & 3);
            vi1 = Fvi[uVar9];
            if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
              ON_SimpleArray<unsigned_int>::Append(ngon_vi,&vi0);
              ON_SimpleArray<unsigned_int>::Append(ngon_vi,&vi1);
            }
            local_38 = uVar4;
            uVar7 = ngon_boundary_index + 1;
            local_4c = 0;
            local_50 = (int)local_40 * 2 + 2;
            local_54 = (int)local_40 * 2 - 1;
            goto LAB_0053ba62;
          }
        }
        ngon_nbr_map = ngon_nbr_map + 1;
        iVar10 = iVar10 + -8;
      }
LAB_0053bb7b:
      uVar7 = 0;
    }
  }
  return uVar7;
LAB_0053ba62:
  if (local_54 < local_4c) {
    return 0;
  }
  if (local_50 < uVar7 - (int)local_38) {
    return 0;
  }
  uVar4 = local_70 & 0xffffffff;
  iVar2 = (int)local_70;
  iVar10 = 4;
  while( true ) {
    bVar12 = iVar10 == 0;
    iVar10 = iVar10 + -1;
    if (bVar12) goto LAB_0053bb7b;
    uVar1 = pNVar11[uVar4].m_NFS[uVar9];
    if (uVar1 != 0) break;
    uVar5 = (int)uVar9 + 1U & 3;
    uVar6 = Fvi[uVar5];
    if (vi1 != uVar6) {
      pNVar11[uVar4].m_NFS[uVar9] = (ulong)uVar7 * 8 + 1;
      if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
        puVar3 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
        *puVar3 = (int)uVar9 + iVar2 * 8;
        uVar6 = Fvi[uVar5];
      }
      uVar7 = uVar7 + 1;
      if (vi0 == uVar6) {
        if (uVar7 - (int)local_38 < 3) {
          return 0;
        }
        return uVar7 - (int)local_38;
      }
      vi1 = uVar6;
      if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
        ON_SimpleArray<unsigned_int>::Append(ngon_vi,&vi1);
      }
    }
    uVar9 = (ulong)uVar5;
  }
  if ((uVar1 & 4) == 0) goto LAB_0053bb7b;
  uVar4 = uVar1 >> 3;
  if ((uint)local_70 == (uint)uVar4) {
    return 0;
  }
  if ((uint)local_40 <= (uint)uVar4) {
    return 0;
  }
  ON_MeshFaceList::QuadFvi(local_60,local_68[uVar4 & 0xffffffff],Fvi);
  uVar6 = (int)uVar1 + 1U & 3;
  local_4c = local_4c + 1;
  local_70 = uVar4;
  uVar9 = (ulong)uVar6;
  pNVar11 = local_48;
  if (vi1 != Fvi[uVar6]) {
    return 0;
  }
  goto LAB_0053ba62;
}

Assistant:

static unsigned int GetNgonBoundarySegments(
  const ON_MeshFaceList& face_list,
  unsigned int ngon_fi_count,
  const unsigned int* ngon_fi,
  unsigned int ngon_boundary_index,
  struct NgonNeighbors* ngon_nbr_map,
  ON_SimpleArray<unsigned int>* ngon_vi,
  ON_SimpleArray<unsigned int>* ngon_side
  )
{
  unsigned int j0, next_j0, j1;
  unsigned int Fvi[4];
  unsigned int vi0, vi1, fi, max_vertex_count;
  unsigned int ngon_fdex, nbr_ngon_fdex, face_vist_count, max_face_visit_count;

  const unsigned int ngon_boundary_index0 = ngon_boundary_index;

  if ( ngon_fi_count <= 0 || 0 == ngon_fi || 0 == ngon_nbr_map )
    return 0;

  if ( 1 == ngon_fi_count )
  {
    if (    0 != ngon_nbr_map[0].m_NFS[0] 
         || 0 != ngon_nbr_map[0].m_NFS[1] 
         || 0 != ngon_nbr_map[0].m_NFS[2] 
         || 0 != ngon_nbr_map[0].m_NFS[3] 
         )
    {
      return 0;
    }
    face_list.QuadFvi(ngon_fi[0],Fvi);

    if ( ngon_vi )
      ngon_vi->Append(Fvi[0]);
    if ( ngon_side )
      ngon_side->AppendNew() = EncodeNgonSide(0,0,false);
    ngon_nbr_map[0].m_NFS[0] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);

    if ( ngon_vi )
      ngon_vi->Append(Fvi[1]);
    if ( ngon_side )
      ngon_side->AppendNew() = EncodeNgonSide(0,1,false);
    ngon_nbr_map[0].m_NFS[1] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);

    if ( Fvi[2] != Fvi[3] )
    {
      if ( ngon_vi )
        ngon_vi->Append(Fvi[2]);
      if ( ngon_side )
        ngon_side->AppendNew() = EncodeNgonSide(0,2,false);
      ngon_nbr_map[0].m_NFS[2] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);
    }

    if ( ngon_vi )
      ngon_vi->Append(Fvi[3]);
    if ( ngon_side )
      ngon_side->AppendNew() = EncodeNgonSide(0,3,false);
    ngon_nbr_map[0].m_NFS[3] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);

    return ngon_boundary_index - ngon_boundary_index0;
  }


  fi = 0;  // keep lint quiet - at this point ngon_fi_count > 0
  j0 = 0;  // keep lint quiet - at this point ngon_fi_count > 0
  
  // find a boundary edge
  for ( ngon_fdex = 0; ngon_fdex < ngon_fi_count; ngon_fdex++ )
  {
    fi = ngon_fi[ngon_fdex];
    face_list.QuadFvi(fi,Fvi);
    for ( j0 = 0; j0 < 4; j0++ )
    {
      if ( Fvi[j0] == Fvi[(j0+1)%4] )
        continue;
      if ( 0 != ngon_nbr_map[ngon_fdex].m_NFS[j0] )
        continue; // has a neighbor or is part of a previously found boundary component when holes are allowed

      // we being at the vertex with index Fvi[j]
      break;
    }    
    if ( j0 < 4 )
      break;
  }
  
  if ( ngon_fdex >= ngon_fi_count )
    return 0;

  // max_vertex_count is used to prevent infinite recursion
  // when the mesh information is not valid or there is
  // a bug in this code.  The maximum value occurs
  // for a strip of quads.
  max_vertex_count = 2*ngon_fi_count + 2;


  // max_face_visit_count is used to prevent infinite recursion
  // when the mesh information is not valid or there is
  // a bug in this code.  The maximum value occurs
  // for a strip of quads when the initial face is
  // at the end of a strip.
  max_face_visit_count = 2*ngon_fi_count - 1;

  ngon_nbr_map[ngon_fdex].m_NFS[j0] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);
  if ( ngon_side )
    ngon_side->AppendNew() = EncodeNgonSide(ngon_fdex,j0,false);

  vi0 = Fvi[j0];
  j0 = (j0+1)%4;
  vi1 = Fvi[j0];
  if ( ngon_vi )
  {
    ngon_vi->Append(vi0);
    ngon_vi->Append(vi1);
  }
  for ( face_vist_count = 0;
        face_vist_count <= max_face_visit_count && ngon_boundary_index - ngon_boundary_index0 <= max_vertex_count;
        face_vist_count++ 
      )
  {
    for (j1 = 0; j1 < 4; j1++, j0 = next_j0 )
    {
      if ( 0 != ngon_nbr_map[ngon_fdex].m_NFS[j0] )
        break; // has a neighbor or is a boundary

      next_j0 = (j0+1)%4;
      if ( vi1 == Fvi[next_j0] )
        continue; // skip over duplicate vertex in triangles

      ngon_nbr_map[ngon_fdex].m_NFS[j0] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);
      if ( ngon_side )
        ngon_side->AppendNew() = EncodeNgonSide(ngon_fdex,j0,false);

      vi1 = Fvi[next_j0];
      if ( vi0 == vi1 )
      {
        // this is where successful searches end with (ngon_vi.Count() >= 3)
        if ( ngon_boundary_index - ngon_boundary_index0 >= 3 )
        {
          return ngon_boundary_index - ngon_boundary_index0;
        }
        return 0;
      }
      if ( ngon_vi )
        ngon_vi->Append(vi1);
    }

    if ( j1 >= 4 )
      break; // not expected - there is a bug or a bogus mesh

    if ( false == IsNFS_Neighbor(ngon_nbr_map[ngon_fdex].m_NFS[j0]) )
      break; // not expected - there is a bug or a bogus mesh

    // switch to neighbor face;
    nbr_ngon_fdex = (unsigned int)DecodeNFS_NgonFaceIndex(ngon_nbr_map[ngon_fdex].m_NFS[j0]);

    if ( nbr_ngon_fdex == ngon_fdex || nbr_ngon_fdex >= ngon_fi_count )
    {
      // Unexpected - bail rather than crash.
      // This means there is a bug in the code that 
      // set the values in the ngon_nbr_map[] array.
      // The same face may be visited multiple times (strip of quads for example),
      // but a face can never be its own neighbor.
      break;
    }

    // move onto the neighbor
    j0 = DecodeNFS_EdgeIndex(ngon_nbr_map[ngon_fdex].m_NFS[j0]);

    ngon_fdex = nbr_ngon_fdex;
    fi = ngon_fi[ngon_fdex];
    face_list.QuadFvi(fi,Fvi);
    // faces have compatible orientations 
    // (The shared edge is reversed when going to neighboring face)
    j0 = (j0+1)%4; // move the the vertex at the end of the shared edge

    if ( vi1 != Fvi[j0] )
    {
      // not expected - there is a bug or a bogus mesh
      break;
    }
  }

  return 0;
}